

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O3

void __thiscall capnp::anon_unknown_0::FakeFileReader::FakeFileReader(FakeFileReader *this)

{
  String *pSVar1;
  size_t sVar2;
  Clock *clock;
  StringPtr pathText;
  Path local_38;
  
  (this->super_Filesystem)._vptr_Filesystem = (_func_int **)&PTR_getRoot_0060c6f8;
  clock = kj::nullClock();
  kj::newInMemoryDirectory((kj *)&local_38,clock);
  (this->root).disposer = (Disposer *)local_38.parts.ptr;
  (this->root).ptr = (Directory *)local_38.parts.size_;
  kj::Path::Path(&local_38,(ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
  pathText.content.size_ = 0x15;
  pathText.content.ptr = "/path/to/current/dir";
  kj::Path::eval(&this->cwd,&local_38,pathText);
  sVar2 = local_38.parts.size_;
  pSVar1 = local_38.parts.ptr;
  if (local_38.parts.ptr != (String *)0x0) {
    local_38.parts.ptr = (String *)0x0;
    local_38.parts.size_ = 0;
    (**(local_38.parts.disposer)->_vptr_ArrayDisposer)
              (local_38.parts.disposer,pSVar1,0x18,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  kj::Directory::openSubdir
            ((Directory *)&this->current,(PathPtr)*(ArrayPtr<const_kj::String> *)&(this->root).ptr,
             (WriteMode)(this->cwd).parts.size_);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }